

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publication.cpp
# Opt level: O3

void __thiscall
miniros::Publication::Publication
          (Publication *this,string *name,string *datatype,string *_md5sum,
          string *message_definition,size_t max_queue,bool latch,bool has_header)

{
  pointer pcVar1;
  
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + name->_M_string_length);
  (this->datatype_)._M_dataplus._M_p = (pointer)&(this->datatype_).field_2;
  pcVar1 = (datatype->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->datatype_,pcVar1,pcVar1 + datatype->_M_string_length);
  (this->md5sum_)._M_dataplus._M_p = (pointer)&(this->md5sum_).field_2;
  pcVar1 = (_md5sum->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->md5sum_,pcVar1,pcVar1 + _md5sum->_M_string_length);
  (this->message_definition_)._M_dataplus._M_p = (pointer)&(this->message_definition_).field_2;
  pcVar1 = (message_definition->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->message_definition_,pcVar1,
             pcVar1 + message_definition->_M_string_length);
  this->max_queue_ = max_queue;
  this->seq_ = 0;
  memset(&this->seq_mutex_,0,0xa9);
  this->latch_ = latch;
  this->has_header_ = has_header;
  (this->last_message_).buf.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->last_message_).buf.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->last_message_).num_bytes = 0;
  (this->last_message_).message_start = (uint8_t *)0x0;
  (this->last_message_).message.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->last_message_).message.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)
   ((long)&(this->last_message_).message.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi + 4) = 0;
  *(undefined8 *)((long)&(this->last_message_).type_info + 4) = 0;
  (this->publish_queue_).
  super__Vector_base<miniros::SerializedMessage,_std::allocator<miniros::SerializedMessage>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->publish_queue_).
  super__Vector_base<miniros::SerializedMessage,_std::allocator<miniros::SerializedMessage>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->publish_queue_).
  super__Vector_base<miniros::SerializedMessage,_std::allocator<miniros::SerializedMessage>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->publish_queue_mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->publish_queue_mutex_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->publish_queue_mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->publish_queue_mutex_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->publish_queue_mutex_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  return;
}

Assistant:

Publication::Publication(const std::string &name,
                         const std::string &datatype,
                         const std::string &_md5sum,
                         const std::string& message_definition,
                         size_t max_queue,
                         bool latch,
                         bool has_header)
: name_(name),
  datatype_(datatype),
  md5sum_(_md5sum),
  message_definition_(message_definition),
  max_queue_(max_queue),
  seq_(0),
  dropped_(false),
  latch_(latch),
  has_header_(has_header),
  intraprocess_subscriber_count_(0)
{
}